

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# worker.cpp
# Opt level: O2

void __thiscall Worker::prepare_containers(Worker *this)

{
  pointer ppTVar1;
  Task *this_00;
  vector<std::unique_ptr<Container,std::default_delete<Container>>,std::allocator<std::unique_ptr<Container,std::default_delete<Container>>>>
  *pvVar2;
  bool bVar3;
  uid_t uVar4;
  pid_t pVar5;
  Container *pCVar6;
  pointer puVar7;
  ContextManager *pCVar8;
  pointer ppTVar9;
  long lVar10;
  Container *created_container;
  vector<Container*,std::allocator<Container*>> *local_68;
  vector<std::unique_ptr<Container,std::default_delete<Container>>,std::allocator<std::unique_ptr<Container,std::default_delete<Container>>>>
  *local_60;
  vector<std::unique_ptr<Container,std::default_delete<Container>>,std::allocator<std::unique_ptr<Container,std::default_delete<Container>>>>
  *local_58;
  string local_50;
  
  ppTVar9 = (this->tasks_).super__Vector_base<libsbox::Task_*,_std::allocator<libsbox::Task_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppTVar1 = (this->tasks_).super__Vector_base<libsbox::Task_*,_std::allocator<libsbox::Task_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  local_60 = (vector<std::unique_ptr<Container,std::default_delete<Container>>,std::allocator<std::unique_ptr<Container,std::default_delete<Container>>>>
              *)&this->permanent_containers_;
  local_68 = (vector<Container*,std::allocator<Container*>> *)&this->containers_;
  local_58 = (vector<std::unique_ptr<Container,std::default_delete<Container>>,std::allocator<std::unique_ptr<Container,std::default_delete<Container>>>>
              *)&this->temporary_containers_;
  lVar10 = 0;
  do {
    if (ppTVar9 == ppTVar1) {
      return;
    }
    this_00 = *ppTVar9;
    bVar3 = libsbox::Task::get_need_ipc(this_00);
    if (bVar3) {
LAB_00112931:
      created_container = (Container *)0x0;
      pCVar6 = (Container *)operator_new(200);
      uVar4 = SharedIdGetter::get(this->id_getter_);
      Container::Container(pCVar6,uVar4,false);
      created_container = pCVar6;
      std::
      vector<std::unique_ptr<Container,std::default_delete<Container>>,std::allocator<std::unique_ptr<Container,std::default_delete<Container>>>>
      ::emplace_back<Container*&>(local_58,&created_container);
      std::vector<Container_*,_std::allocator<Container_*>_>::push_back
                ((vector<Container_*,_std::allocator<Container_*>_> *)local_68,&created_container);
    }
    else {
      bVar3 = libsbox::Task::get_use_standard_binds(this_00);
      if (!bVar3) goto LAB_00112931;
      created_container = (Container *)0x0;
      puVar7 = (this->permanent_containers_).
               super__Vector_base<std::unique_ptr<Container,_std::default_delete<Container>_>,_std::allocator<std::unique_ptr<Container,_std::default_delete<Container>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (lVar10 == (long)(this->permanent_containers_).
                          super__Vector_base<std::unique_ptr<Container,_std::default_delete<Container>_>,_std::allocator<std::unique_ptr<Container,_std::default_delete<Container>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)puVar7 >> 3) {
        pCVar6 = (Container *)operator_new(200);
        uVar4 = SharedIdGetter::get(this->id_getter_);
        Container::Container(pCVar6,uVar4,true);
        pvVar2 = local_60;
        created_container = pCVar6;
        std::
        vector<std::unique_ptr<Container,std::default_delete<Container>>,std::allocator<std::unique_ptr<Container,std::default_delete<Container>>>>
        ::emplace_back<Container*&>(local_60,&created_container);
        puVar7 = *(pointer *)pvVar2;
      }
      local_50._M_dataplus._M_p =
           *(pointer *)
            &puVar7[lVar10]._M_t.super___uniq_ptr_impl<Container,_std::default_delete<Container>_>.
             _M_t;
      std::vector<Container*,std::allocator<Container*>>::emplace_back<Container*>
                (local_68,(Container **)&local_50);
      lVar10 = lVar10 + 1;
    }
    if (created_container != (Container *)0x0) {
      pVar5 = Container::start(created_container);
      if (pVar5 < 0) {
        pCVar8 = ContextManager::get();
        format_abi_cxx11_(&local_50,"Cannot start() container: %m");
        (**pCVar8->_vptr_ContextManager)(pCVar8,&local_50);
        std::__cxx11::string::~string((string *)&local_50);
      }
    }
    ppTVar9 = ppTVar9 + 1;
  } while( true );
}

Assistant:

void Worker::prepare_containers() {
    size_t next_permanent_container = 0;
    for (auto task : tasks_) {
        bool permanent_container_allowed = true;
        if (task->get_need_ipc() || !task->get_use_standard_binds()) {
            permanent_container_allowed = false;
        }

        Container *created_container = nullptr;
        if (permanent_container_allowed) {
            if (next_permanent_container == permanent_containers_.size()) {
                created_container = new Container(id_getter_->get(), true);
                permanent_containers_.emplace_back(created_container);
            }
            containers_.push_back(permanent_containers_[next_permanent_container].get());
            next_permanent_container++;
        } else {
            created_container = new Container(id_getter_->get(), false);
            temporary_containers_.emplace_back(created_container);
            containers_.push_back(created_container);
        }

        if (created_container != nullptr) {
            if (created_container->start() < 0) {
                die(format("Cannot start() container: %m"));
            }
        }
    }
}